

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

void anon_unknown.dwarf_68bbba::TreeChildrenIterator::Iterate<duckdb::PhysicalOperator>
               (PhysicalOperator *op,function<void_(const_duckdb::PhysicalOperator_&)> *callback)

{
  reference_wrapper<const_duckdb::PhysicalOperator> *child;
  undefined8 *puVar1;
  undefined8 *local_30;
  undefined8 *local_28;
  
  (*op->_vptr_PhysicalOperator[5])(&local_30,op);
  for (puVar1 = local_30; puVar1 != local_28; puVar1 = puVar1 + 1) {
    duckdb::std::function<void_(const_duckdb::PhysicalOperator_&)>::operator()
              (callback,(PhysicalOperator *)*puVar1);
  }
  duckdb::std::
  _Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
                   *)&local_30);
  return;
}

Assistant:

void TreeChildrenIterator::Iterate(const PhysicalOperator &op,
                                   const std::function<void(const PhysicalOperator &child)> &callback) {
	for (auto &child : op.GetChildren()) {
		callback(child);
	}
}